

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateTemplateNode::Expand
          (TemplateTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  char *pcVar6;
  TemplateDictionaryInterface *dictionary_00;
  undefined4 extraout_var_01;
  char *filename_1;
  TemplateDictionaryInterface *child;
  int dict_num;
  bool error_free;
  char *filename;
  Iterator *di;
  TemplateCache *cache_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionaryInterface *dictionary_local;
  ExpandEmitter *output_buffer_local;
  TemplateTemplateNode *this_local;
  long *plVar4;
  undefined4 extraout_var_00;
  
  uVar2 = (*dictionary->_vptr_TemplateDictionaryInterface[5])(dictionary,&this->variable_);
  if ((uVar2 & 1) == 0) {
    iVar3 = (*dictionary->_vptr_TemplateDictionaryInterface[7])(dictionary,&this->variable_);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    uVar5 = (**(code **)(*plVar4 + 0x10))();
    if ((uVar5 & 1) == 0) {
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      iVar3 = (*dictionary->_vptr_TemplateDictionaryInterface[6])(dictionary,&this->variable_,0);
      pcVar6 = (char *)CONCAT44(extraout_var_00,iVar3);
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = ExpandOnce(this,output_buffer,dictionary,pcVar6,per_expand_data,cache);
      }
    }
    else {
      this_local._7_1_ = true;
      child._0_4_ = 0;
      while (uVar5 = (**(code **)(*plVar4 + 0x10))(), (uVar5 & 1) != 0) {
        dictionary_00 = (TemplateDictionaryInterface *)(**(code **)(*plVar4 + 0x18))();
        iVar3 = (*dictionary->_vptr_TemplateDictionaryInterface[6])
                          (dictionary,&this->variable_,(ulong)(uint)child);
        pcVar6 = (char *)CONCAT44(extraout_var_01,iVar3);
        if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
          bVar1 = ExpandOnce(this,output_buffer,dictionary_00,pcVar6,per_expand_data,cache);
          this_local._7_1_ = (this_local._7_1_ & bVar1) != 0;
        }
        child._0_4_ = (uint)child + 1;
      }
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TemplateTemplateNode::Expand(ExpandEmitter *output_buffer,
                                  const TemplateDictionaryInterface *dictionary,
                                  PerExpandData *per_expand_data,
                                  const TemplateCache *cache) const {
  if (dictionary->IsHiddenTemplate(variable_)) {
    // if this "template include" section is "hidden", do nothing
    return true;
  }

  TemplateDictionaryInterface::Iterator* di =
      dictionary->CreateTemplateIterator(variable_);

  if (!di->HasNext()) {  // empty dict means 'expand once using containing dict'
    delete di;
    // TODO(csilvers): have this return a TemplateString instead?
    const char* const filename =
        dictionary->GetIncludeTemplateName(variable_, 0);
    // If the filename wasn't set then treat it as if it were "hidden", i.e, do
    // nothing
    if (filename && *filename) {
      return ExpandOnce(output_buffer, *dictionary, filename, per_expand_data,
                        cache);
    } else {
      return true;
    }
  }

  bool error_free = true;
  for (int dict_num = 0; di->HasNext(); ++dict_num) {
    const TemplateDictionaryInterface& child = di->Next();
    // We do this in the loop, because maybe one day we'll support
    // each expansion having its own template dictionary.  That's also
    // why we pass in the dictionary-index as an argument.
    const char* const filename = dictionary->GetIncludeTemplateName(
        variable_, dict_num);
    // If the filename wasn't set then treat it as if it were "hidden", i.e, do
    // nothing
    if (filename && *filename) {
      error_free &= ExpandOnce(output_buffer, child, filename, per_expand_data,
                               cache);
    }
  }
  delete di;

  return error_free;
}